

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O1

void __thiscall
SStringViewArchive_WriteHello_Test::TestBody(SStringViewArchive_WriteHello_Test *this)

{
  database *db;
  span<unsigned_char,__1L> sp;
  typed_address<char> first;
  typed_address<char> last;
  char *message;
  _func_int **message_00;
  database_writer writer;
  mock_mutex mutex;
  database_reader reader;
  AssertionResult gtest_ar;
  shared_sstring_view str;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _StackY_c8;
  pointer local_c0;
  bool local_b8;
  undefined1 local_a9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff58;
  AssertHelper local_90;
  undefined1 local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  pointer local_78;
  shared_sstring_view local_70;
  transaction<std::unique_lock<mock_mutex>_> local_58;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  anon_unknown.dwarf_3808b8::SStringViewArchive::make_shared_sstring_view(&local_70,"hello");
  local_d0 = (undefined1  [8])&local_a9;
  _StackY_c8._M_pi = _StackY_c8._M_pi & 0xffffffffffffff00;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_d0);
  db = &(this->super_SStringViewArchive).db_;
  _StackY_c8._M_pi._0_1_ =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_58,db,(lock_type *)local_d0);
  if ((_StackY_c8._M_pi._0_1_ ==
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x1) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_d0 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    _StackY_c8._M_pi._0_1_ =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
  }
  first.a_.a_._0_4_ = (*local_58.super_transaction_base._vptr_transaction_base[2])(&local_58,0,1);
  first.a_.a_._4_4_ = extraout_var;
  local_c0 = (pointer)0x0;
  local_b8 = false;
  local_d0 = (undefined1  [8])&PTR__writer_base_00271350;
  _StackY_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_58;
  pstore::serialize::string_helper::
  write<pstore::serialize::archive::database_writer&,pstore::sstring_view<std::shared_ptr<char_const>>>
            ((database_writer *)local_d0,&local_70);
  local_d0 = (undefined1  [8])&PTR__writer_base_00271398;
  if (local_b8 == false) {
    local_b8 = true;
  }
  last.a_.a_._0_4_ = (*local_58.super_transaction_base._vptr_transaction_base[2])(&local_58,0,1);
  last.a_.a_._4_4_ = extraout_var_00;
  anon_unknown.dwarf_3808b8::SStringViewArchive::as_vector
            ((vector<char,_std::allocator<char>_> *)local_d0,&this->super_SStringViewArchive,first,
             last);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char,char,char,char,char,char,char>>>
  ::operator()(local_88,&stack0xffffffffffffff60,
               (vector<char,_std::allocator<char>_> *)"as_vector (first, last)");
  if (local_d0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d0,(long)local_c0 - (long)local_d0);
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_80._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((_Alloc_hider *)&(_Stack_80._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp"
               ,0x7d,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff60,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_d0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(undefined **)local_d0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_80._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_80._M_pi);
  }
  sp.storage_.data_._0_4_ = (int)db;
  sp.storage_.super_extent_type<_1L>.size_ = (index_type)in_stack_ffffffffffffff58._M_head_impl;
  sp.storage_.data_._4_2_ = (short)((ulong)db >> 0x20);
  sp.storage_.data_._6_1_ = (char)((ulong)db >> 0x30);
  sp.storage_.data_._7_1_ = (char)((ulong)db >> 0x38);
  pstore::serialize::flood<_1l>(sp);
  pstore::serialize::serializer<pstore::sstring_view<std::shared_ptr<char_const>>,void>::
  readsv<pstore::serialize::archive::database_reader&>
            ((database_reader *)&stack0xffffffffffffff60,(value_type *)local_d0);
  local_88 = local_d0;
  _Stack_80._M_pi = _StackY_c8._M_pi;
  local_78 = local_c0;
  testing::internal::CmpHelperEQ<pstore::sstring_view<std::shared_ptr<char_const>>,char[6]>
            ((internal *)local_d0,"actual","\"hello\"",
             (sstring_view<std::shared_ptr<const_char>_> *)local_88,(char (*) [6])"hello");
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff58);
    if ((transaction<std::unique_lock<mock_mutex>_> *)_StackY_c8._M_pi ==
        (transaction<std::unique_lock<mock_mutex>_> *)0x0) {
      message_00 = (_func_int **)0x21a169;
    }
    else {
      message_00 = ((transaction_base *)&(_StackY_c8._M_pi)->_vptr__Sp_counted_base)->
                   _vptr_transaction_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp"
               ,0x81,(char *)message_00);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff58._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff58._M_head_impl + 8))();
    }
  }
  if ((transaction<std::unique_lock<mock_mutex>_> *)_StackY_c8._M_pi !=
      (transaction<std::unique_lock<mock_mutex>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_StackY_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _StackY_c8._M_pi);
  }
  if ((transaction<std::unique_lock<mock_mutex>_> *)_Stack_80._M_pi !=
      (transaction<std::unique_lock<mock_mutex>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  local_58.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00271290;
  pstore::transaction_base::rollback(&local_58.super_transaction_base);
  if ((local_58.lock_._M_owns == true) && (local_58.lock_._M_device != (mutex_type *)0x0)) {
    local_58.lock_._M_owns = false;
  }
  if (local_70.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

TEST_F (SStringViewArchive, WriteHello) {
    auto str = make_shared_sstring_view ("hello");

    mock_mutex mutex;
    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
    auto const first = pstore::typed_address<char> (this->current_pos (transaction));
    {
        auto writer = pstore::serialize::archive::make_writer (transaction);
        pstore::serialize::write (writer, str);
    }
    auto const last = pstore::typed_address<char> (this->current_pos (transaction));
    EXPECT_THAT (as_vector (first, last),
                 ::testing::ElementsAre ('\xb', '\x0', 'h', 'e', 'l', 'l', 'o'));
    {
        auto reader = pstore::serialize::archive::database_reader{db_, first.to_address ()};
        shared_sstring_view const actual = pstore::serialize::read<shared_sstring_view> (reader);
        EXPECT_EQ (actual, "hello");
    }
}